

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# questpgr.c
# Opt level: O2

void convert_line(void)

{
  char cVar1;
  char cVar2;
  short sVar3;
  boolean bVar4;
  int iVar5;
  char *pcVar6;
  dungeon *pdVar7;
  size_t sVar8;
  long lVar9;
  aligntyp aVar10;
  char *__dest;
  char *pcVar11;
  char *pcVar12;
  bool bVar13;
  
  pcVar11 = in_line;
  lVar9 = 0;
  do {
    __dest = out_line + lVar9;
    if (*pcVar11 == '\0') {
      if (0x7f < lVar9) {
        panic("convert_line: overflow");
      }
LAB_0021c5bc:
      *__dest = '\0';
      return;
    }
    *__dest = '\0';
    cVar1 = *pcVar11;
    if (cVar1 != '%') {
      if ((cVar1 != '\r') && (cVar1 != '\n')) {
LAB_0021c157:
        out_line[lVar9] = cVar1;
        lVar9 = lVar9 + 1;
        pcVar12 = pcVar11;
        goto LAB_0021c523;
      }
      __dest = out_line + lVar9 + 1;
      goto LAB_0021c5bc;
    }
    cVar2 = pcVar11[1];
    pcVar12 = plname;
    switch(cVar2) {
    case 'A':
      aVar10 = u.ualign.type;
      goto LAB_0021c237;
    case 'B':
    case 'E':
    case 'F':
    case 'I':
    case 'J':
    case 'K':
    case 'M':
    case 'O':
    case 'P':
    case 'Q':
    case 'T':
    case 'U':
    case 'V':
    case 'W':
    case 'X':
    case 'Y':
    case '[':
    case '\\':
    case ']':
    case '^':
    case '_':
    case '`':
    case 'b':
    case 'e':
    case 'f':
    case 'h':
    case 'j':
    case 'k':
    case 'q':
    case 't':
    case 'u':
    case 'v':
    case 'w':
switchD_0021c189_caseD_42:
      pcVar12 = ((dungeon *)0x29394c)->dname;
      break;
    case 'C':
      pcVar12 = "chaotic";
      break;
    case 'D':
      aVar10 = '\x01';
      goto LAB_0021c2a8;
    case 'G':
      pcVar12 = align_gtitle(u.ualignbase[1]);
      break;
    case 'H':
      pcVar12 = urole.homebase;
      break;
    case 'L':
      pcVar12 = "lawful";
      break;
    case 'N':
      pcVar12 = "neutral";
      break;
    case 'R':
      iVar5 = 10;
      goto LAB_0021c429;
    case 'S':
      bVar13 = flags.female == '\0';
      pcVar12 = "daughter";
      pdVar7 = (dungeon *)0x2c64df;
      goto LAB_0021c3e6;
    case 'Z':
      pcVar12 = dungeons[0].dname;
      break;
    case 'a':
      aVar10 = u.ualignbase[1];
LAB_0021c237:
      pcVar12 = align_str(aVar10);
      break;
    case 'c':
      pcVar12 = urole.name.f;
      if (urole.name.f == (char *)0x0) {
        pcVar12 = urole.name.m;
      }
      bVar13 = flags.female == '\0';
      pdVar7 = (dungeon *)urole.name.m;
      goto LAB_0021c3e6;
    case 'd':
      aVar10 = u.ualignbase[1];
LAB_0021c2a8:
      pcVar12 = align_gname(aVar10);
      break;
    case 'g':
      pcVar12 = mons_mname(mons + urole.guardnum);
      break;
    case 'i':
      pcVar12 = urole.intermed;
      break;
    case 'l':
      sVar3 = urole.ldrnum;
      goto LAB_0021c31f;
    case 'm':
      bVar4 = pirateday();
      pcVar12 = "the FSM";
      if (bVar4 == '\0') {
        bVar4 = discordian_holiday();
        if (bVar4 != '\0') {
          bVar13 = (u.ubirthday & 1U) == 0;
          pcVar12 = "Discordia";
          pdVar7 = (dungeon *)"Eris";
          goto LAB_0021c3e6;
        }
        pcVar12 = (char *)(creator_names_rel +
                          *(int *)(creator_names_rel + (u.ubirthday % 0x13) * 4));
      }
      break;
    case 'n':
      sVar3 = urole.neminum;
LAB_0021c31f:
      pcVar12 = "";
      if ((mons[sVar3].mflags2 & 0x80000) == 0) {
        pcVar12 = "the ";
      }
      pcVar6 = mons_mname(mons + sVar3);
      sprintf(nambuf,"%s%s",pcVar12,pcVar6);
      pcVar12 = nambuf;
      break;
    case 'o':
      pcVar12 = artiname((int)urole.questarti);
      pcVar12 = the(pcVar12);
      break;
    case 'p':
      break;
    case 'r':
      iVar5 = u.ulevel;
LAB_0021c429:
      pcVar12 = rank_of(iVar5,urole.malenum,flags.female);
      break;
    case 's':
      bVar13 = flags.female == '\0';
      pcVar12 = "sister";
      pdVar7 = (dungeon *)"brother";
      goto LAB_0021c3e6;
    case 'x':
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
          pcVar12 = ((dungeon *)0x292da4)->dname;
          if (((youmonst.data)->mflags1 & 0x1000) == 0) break;
          goto LAB_0021c25f;
        }
      }
      else {
LAB_0021c25f:
        pcVar12 = "sense";
        if (ublindf == (obj *)0x0) break;
      }
      bVar13 = ublindf->oartifact == '\x1d';
      pcVar12 = "sense";
      pdVar7 = (dungeon *)0x292da4;
LAB_0021c3e6:
      if (bVar13) {
        pcVar12 = pdVar7->dname;
      }
      break;
    default:
      if (cVar2 == '\0') goto LAB_0021c157;
      if (cVar2 != '%') goto switchD_0021c189_caseD_42;
      pcVar12 = ((dungeon *)0x2c3c54)->dname;
    }
    strcpy(cvt_buf,pcVar12);
    pcVar12 = pcVar11 + 2;
    cVar1 = pcVar11[2];
    if (cVar1 == 't') {
      iVar5 = strncasecmp(cvt_buf,"the ",4);
      if (iVar5 == 0) {
        pcVar11 = cvt_buf + 4;
        goto LAB_0021c4a3;
      }
LAB_0021c50a:
      strcat(__dest,cvt_buf);
      __dest = cvt_buf;
    }
    else {
      if (cVar1 == 'C') {
        cvt_buf[0] = highc(cvt_buf[0]);
        goto LAB_0021c50a;
      }
      if (cVar1 == 'P') {
        cvt_buf[0] = highc(cvt_buf[0]);
LAB_0021c4f7:
        pcVar11 = makeplural(cvt_buf);
LAB_0021c4ff:
        strcpy(cvt_buf,pcVar11);
        goto LAB_0021c50a;
      }
      if (cVar1 == 'S') {
        cvt_buf[0] = highc(cvt_buf[0]);
LAB_0021c4db:
        pcVar11 = s_suffix(cvt_buf);
        goto LAB_0021c4ff;
      }
      if (cVar1 == 'a') {
        pcVar11 = an(cvt_buf);
      }
      else {
        if (cVar1 == 'p') goto LAB_0021c4f7;
        if (cVar1 == 's') goto LAB_0021c4db;
        if (cVar1 != 'A') {
          pcVar12 = pcVar11 + 1;
          goto LAB_0021c50a;
        }
        pcVar11 = An(cvt_buf);
      }
LAB_0021c4a3:
      strcat(__dest,pcVar11);
    }
    sVar8 = strlen(__dest);
    lVar9 = sVar8 + lVar9;
LAB_0021c523:
    pcVar11 = pcVar12 + 1;
  } while( true );
}

Assistant:

static void convert_line(void)
{
	char *c, *cc;

	cc = out_line;
	for (c = in_line; *c; c++) {

	    *cc = 0;
	    switch(*c) {

		case '\r':
		case '\n':
			*(++cc) = 0;
			return;

		case '%':
			if (*(c+1)) {
			    convert_arg(*(++c));
			    switch (*(++c)) {

					/* insert "a"/"an" prefix */
				case 'A': strcat(cc, An(cvt_buf));
				    cc += strlen(cc);
				    continue; /* for */
				case 'a': strcat(cc, an(cvt_buf));
				    cc += strlen(cc);
				    continue; /* for */

					/* capitalize */
				case 'C': cvt_buf[0] = highc(cvt_buf[0]);
				    break;

					/* pluralize */
				case 'P': cvt_buf[0] = highc(cvt_buf[0]);
				case 'p': strcpy(cvt_buf, makeplural(cvt_buf));
				    break;

					/* append possessive suffix */
				case 'S': cvt_buf[0] = highc(cvt_buf[0]);
				case 's': strcpy(cvt_buf, s_suffix(cvt_buf));
				    break;

					/* strip any "the" prefix */
				case 't': if (!strncmpi(cvt_buf, "the ", 4)) {
					strcat(cc, &cvt_buf[4]);
					cc += strlen(cc);
					continue; /* for */
				    }
				    break;

				default: --c;	/* undo switch increment */
				    break;
			    }
			    strcat(cc, cvt_buf);
			    cc += strlen(cvt_buf);
			    break;
			}	/* else fall through */

		default:
			*cc++ = *c;
			break;
	    }
	}
	if (cc >= out_line + sizeof out_line)
	    panic("convert_line: overflow");
	*cc = 0;
	return;
}